

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Medium::Medium(Medium *this,string *type)

{
  string *in_RSI;
  long in_RDI;
  
  ParamSet::ParamSet((ParamSet *)0x19800c);
  std::__cxx11::string::string((string *)(in_RDI + 0x30),in_RSI);
  return;
}

Assistant:

Medium(const std::string &type) : type(type) {}